

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# main.cc
# Opt level: O0

int main(void)

{
  size_type __n;
  char *pcVar1;
  ostream *poVar2;
  uint32_t local_4ac;
  undefined1 local_4a8 [4];
  int i;
  PowerCore core;
  undefined1 local_288 [8];
  vector<char,_std::allocator<char>_> stack;
  undefined1 local_268 [8];
  vector<char,_std::allocator<char>_> code;
  undefined8 local_248;
  fpos local_240 [16];
  size_type local_230;
  size_t sz;
  char local_218 [8];
  ifstream in;
  
  std::ifstream::ifstream(local_218,"testfun.bin",8);
  std::istream::seekg((long)local_218,_S_beg);
  local_240 = (fpos  [16])std::istream::tellg();
  local_230 = std::fpos::operator_cast_to_long(local_240);
  std::fpos<__mbstate_t>::fpos
            ((fpos<__mbstate_t> *)
             &code.super__Vector_base<char,_std::allocator<char>_>._M_impl.field_0x10,0);
  std::istream::seekg(local_218,code.super__Vector_base<char,_std::allocator<char>_>._M_impl._16_8_,
                      local_248);
  __n = local_230;
  std::allocator<char>::allocator();
  std::vector<char,_std::allocator<char>_>::vector
            ((vector<char,_std::allocator<char>_> *)local_268,__n,
             (allocator_type *)
             &stack.super__Vector_base<char,_std::allocator<char>_>._M_impl.field_0x17);
  std::allocator<char>::~allocator
            ((allocator<char> *)
             &stack.super__Vector_base<char,_std::allocator<char>_>._M_impl.field_0x17);
  pcVar1 = std::vector<char,_std::allocator<char>_>::data
                     ((vector<char,_std::allocator<char>_> *)local_268);
  std::istream::read(local_218,(long)pcVar1);
  std::allocator<char>::allocator();
  std::vector<char,_std::allocator<char>_>::vector
            ((vector<char,_std::allocator<char>_> *)local_288,0x100000,
             (allocator_type *)((long)&core.blocks._M_h._M_single_bucket + 7));
  std::allocator<char>::~allocator
            ((allocator<char> *)((long)&core.blocks._M_h._M_single_bucket + 7));
  PowerCore::PowerCore((PowerCore *)local_4a8);
  core.super_PowerCoreState._400_8_ =
       std::vector<char,_std::allocator<char>_>::data
                 ((vector<char,_std::allocator<char>_> *)local_268);
  pcVar1 = std::vector<char,_std::allocator<char>_>::data
                     ((vector<char,_std::allocator<char>_> *)local_288);
  core.memoryBases[0] = pcVar1 + -0x40000000;
  i = 0x400ffc00;
  for (local_4ac = 0; (int)local_4ac < 0xf; local_4ac = local_4ac + 1) {
    core.super_PowerCoreState.r[1] = local_4ac;
    poVar2 = std::operator<<((ostream *)&std::cout,"in: ");
    poVar2 = (ostream *)std::ostream::operator<<(poVar2,std::dec);
    poVar2 = (ostream *)std::ostream::operator<<(poVar2,core.super_PowerCoreState.r[1]);
    std::ostream::operator<<(poVar2,std::endl<char,std::char_traits<char>>);
    core.super_PowerCoreState.lr = 0;
    core.super_PowerCoreState.f[0x1f]._4_4_ = 0xfffffffc;
    PowerCore::execute((PowerCore *)local_4a8);
    poVar2 = std::operator<<((ostream *)&std::cout,"out: ");
    poVar2 = (ostream *)std::ostream::operator<<(poVar2,std::dec);
    poVar2 = (ostream *)std::ostream::operator<<(poVar2,core.super_PowerCoreState.r[1]);
    std::ostream::operator<<(poVar2,std::endl<char,std::char_traits<char>>);
  }
  PowerCore::~PowerCore((PowerCore *)local_4a8);
  std::vector<char,_std::allocator<char>_>::~vector
            ((vector<char,_std::allocator<char>_> *)local_288);
  std::vector<char,_std::allocator<char>_>::~vector
            ((vector<char,_std::allocator<char>_> *)local_268);
  std::ifstream::~ifstream(local_218);
  return 0;
}

Assistant:

int main()
{
    std::ifstream in("testfun.bin");
    in.seekg(0, std::ios::end);
    size_t sz = in.tellg();
    in.seekg(0);

    std::vector<char> code(sz);
    in.read(code.data(),sz);

    std::vector<char> stack(1024 * 1024);

    PowerCore core;

    core.memoryBases[0] = code.data();
    core.memoryBases[1] = stack.data() - 0x40000000;
    core.r[1] = 0x40000000 + 1024 * 1024 - 1024;

    for(int i = 0; i < 15; i++)
    {
        core.r[3] = i;
        std::cout << "in: " << std::dec << core.r[3] << std::endl;
        
        core.CIA = 0;
        core.lr = 0xFFFFFFFC;
        core.execute();

        std::cout << "out: " << std::dec << core.r[3] << std::endl;
    }

    return 0;
}